

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Module> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
          (RefPtr<wabt::interp::Module> *__return_storage_ptr__,Store *this,Store *args,
          ModuleDesc *args_1)

{
  Module *pMVar1;
  Index index;
  ModuleDesc local_158;
  Module *local_38;
  Ref local_30;
  Ref ref;
  ModuleDesc *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Module> *ptr;
  
  ref.index = (size_t)args_1;
  pMVar1 = (Module *)operator_new(400);
  ModuleDesc::ModuleDesc(&local_158,(ModuleDesc *)ref.index);
  Module::Module(pMVar1,args,&local_158);
  local_38 = pMVar1;
  index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
          ::New<wabt::interp::Module*>
                    ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                      *)&this->objects_,&local_38);
  Ref::Ref(&local_30,index);
  ModuleDesc::~ModuleDesc(&local_158);
  RefPtr<wabt::interp::Module>::RefPtr(__return_storage_ptr__,this,local_30);
  pMVar1 = RefPtr<wabt::interp::Module>::operator->(__return_storage_ptr__);
  (pMVar1->super_Object).self_.index = local_30.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}